

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

uint32_t google::protobuf::internal::FastParseTableSize
                   (size_t num_fields,optional<unsigned_int> end_group_tag)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint32_t local_30;
  type_conflict3 local_28;
  unsigned_long local_20;
  size_t local_18;
  size_t num_fields_local;
  optional<unsigned_int> end_group_tag_local;
  
  local_18 = num_fields;
  num_fields_local =
       (size_t)end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>;
  bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&num_fields_local);
  if (bVar1) {
    local_30 = 0x20;
  }
  else {
    local_20 = 1;
    local_28 = absl::lts_20250127::bit_ceil<unsigned_long>(local_18 + 1);
    puVar2 = std::min<unsigned_long>(&TcParseTableBase::kMaxFastFields,&local_28);
    puVar2 = std::max<unsigned_long>(&local_20,puVar2);
    local_30 = (uint32_t)*puVar2;
  }
  return local_30;
}

Assistant:

uint32_t FastParseTableSize(size_t num_fields,
                            absl::optional<uint32_t> end_group_tag) {
  return end_group_tag.has_value()
             ? TcParseTableBase::kMaxFastFields
             : std::max(size_t{1}, std::min(TcParseTableBase::kMaxFastFields,
                                            absl::bit_ceil(num_fields + 1)));
}